

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::stringstream_parser<float>(string *text,float *value)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  float *in_RSI;
  string *in_RDI;
  stringstream in;
  string *text_00;
  string local_198 [12];
  float *local_10;
  
  local_10 = in_RSI;
  _Var2 = std::operator|(_S_out,_S_in);
  text_00 = local_198;
  std::__cxx11::stringstream::stringstream((stringstream *)text_00,in_RDI,_Var2);
  std::istream::operator>>((istream *)text_00,local_10);
  bVar1 = std::ios::operator!((ios *)(&local_198[0]._M_dataplus +
                                     *(long *)(local_198[0]._0_8_ + -0x18)));
  if ((bVar1 & 1) != 0) {
    throw_or_mimic<cxxopts::argument_incorrect_type>(text_00);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return;
}

Assistant:

void stringstream_parser(const std::string& text, T& value)
    {
      std::stringstream in(text);
      in >> value;
      if (!in) {
        throw_or_mimic<argument_incorrect_type>(text);
      }
    }